

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

void Abc_SclWriteLibrary(Vec_Str_t *vOut,SC_Lib *p)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pStr;
  void *pvVar4;
  undefined8 *puVar5;
  word Val;
  undefined8 *puVar6;
  float fVar7;
  char *local_f0;
  SC_Timing *pTime;
  word uWord;
  SC_Timings *pRTime;
  int k;
  int j;
  int i;
  int n_valid_cells;
  SC_Pin *pPin;
  SC_Cell *pCell;
  SC_WireLoadSel *pWLS;
  SC_WireLoad *pWL;
  SC_Lib *p_local;
  Vec_Str_t *vOut_local;
  
  Vec_StrPutI(vOut,8);
  Vec_StrPutS(vOut,p->pName);
  Vec_StrPutS(vOut,p->default_wire_load);
  Vec_StrPutS(vOut,p->default_wire_load_sel);
  Vec_StrPutF(vOut,p->default_max_out_slew);
  if (p->unit_time < 0) {
    __assert_fail("p->unit_time >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                  ,0x1f7,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
  }
  if (p->unit_cap_snd < 0) {
    __assert_fail("p->unit_cap_snd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                  ,0x1f8,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
  }
  Vec_StrPutI(vOut,p->unit_time);
  Vec_StrPutF(vOut,p->unit_cap_fst);
  Vec_StrPutI(vOut,p->unit_cap_snd);
  iVar1 = Vec_PtrSize(&p->vWireLoads);
  Vec_StrPutI(vOut,iVar1);
  for (k = 0; iVar1 = Vec_PtrSize(&p->vWireLoads), k < iVar1; k = k + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(&p->vWireLoads,k);
    Vec_StrPutS(vOut,(char *)*puVar3);
    Vec_StrPutF(vOut,*(float *)(puVar3 + 1));
    Vec_StrPutF(vOut,*(float *)((long)puVar3 + 0xc));
    iVar1 = Vec_IntSize((Vec_Int_t *)(puVar3 + 2));
    Vec_StrPutI(vOut,iVar1);
    for (pRTime._4_4_ = 0; iVar1 = Vec_IntSize((Vec_Int_t *)(puVar3 + 2)), pRTime._4_4_ < iVar1;
        pRTime._4_4_ = pRTime._4_4_ + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)(puVar3 + 2),pRTime._4_4_);
      Vec_StrPutI(vOut,iVar1);
      fVar7 = Vec_FltEntry((Vec_Flt_t *)(puVar3 + 4),pRTime._4_4_);
      Vec_StrPutF(vOut,fVar7);
    }
  }
  iVar1 = Vec_PtrSize(&p->vWireLoadSels);
  Vec_StrPutI(vOut,iVar1);
  for (k = 0; iVar1 = Vec_PtrSize(&p->vWireLoadSels), k < iVar1; k = k + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(&p->vWireLoadSels,k);
    Vec_StrPutS(vOut,(char *)*puVar3);
    iVar1 = Vec_FltSize((Vec_Flt_t *)(puVar3 + 1));
    Vec_StrPutI(vOut,iVar1);
    for (pRTime._4_4_ = 0; iVar1 = Vec_FltSize((Vec_Flt_t *)(puVar3 + 1)), pRTime._4_4_ < iVar1;
        pRTime._4_4_ = pRTime._4_4_ + 1) {
      fVar7 = Vec_FltEntry((Vec_Flt_t *)(puVar3 + 1),pRTime._4_4_);
      Vec_StrPutF(vOut,fVar7);
      fVar7 = Vec_FltEntry((Vec_Flt_t *)(puVar3 + 3),pRTime._4_4_);
      Vec_StrPutF(vOut,fVar7);
      pStr = (char *)Vec_PtrEntry((Vec_Ptr_t *)(puVar3 + 5),pRTime._4_4_);
      Vec_StrPutS(vOut,pStr);
    }
  }
  j = 0;
  for (k = 0; iVar1 = Vec_PtrSize(&p->vCells), k < iVar1; k = k + 1) {
    pvVar4 = Vec_PtrEntry(&p->vCells,k);
    if ((*(int *)((long)pvVar4 + 0x10) == 0) && (*(int *)((long)pvVar4 + 0x14) == 0)) {
      j = j + 1;
    }
  }
  Vec_StrPutI(vOut,j);
  k = 0;
  do {
    iVar1 = Vec_PtrSize(&p->vCells);
    if (iVar1 <= k) {
      return;
    }
    puVar3 = (undefined8 *)Vec_PtrEntry(&p->vCells,k);
    if ((*(int *)(puVar3 + 2) == 0) && (*(int *)((long)puVar3 + 0x14) == 0)) {
      Vec_StrPutS(vOut,(char *)*puVar3);
      Vec_StrPutF(vOut,*(float *)(puVar3 + 3));
      Vec_StrPutF(vOut,*(float *)((long)puVar3 + 0x1c));
      Vec_StrPutI(vOut,*(int *)(puVar3 + 5));
      Vec_StrPutI(vOut,*(int *)(puVar3 + 8));
      Vec_StrPutI(vOut,*(int *)((long)puVar3 + 0x44));
      for (pRTime._4_4_ = 0; pRTime._4_4_ < *(int *)(puVar3 + 8); pRTime._4_4_ = pRTime._4_4_ + 1) {
        puVar5 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar3 + 6),pRTime._4_4_);
        if (*(int *)(puVar5 + 1) != 1) {
          __assert_fail("pPin->dir == sc_dir_Input",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                        ,0x232,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
        }
        Vec_StrPutS(vOut,(char *)*puVar5);
        Vec_StrPutF(vOut,*(float *)(puVar5 + 2));
        Vec_StrPutF(vOut,*(float *)((long)puVar5 + 0x14));
      }
      for (pRTime._4_4_ = *(int *)(puVar3 + 8); iVar1 = Vec_PtrSize((Vec_Ptr_t *)(puVar3 + 6)),
          pRTime._4_4_ < iVar1; pRTime._4_4_ = pRTime._4_4_ + 1) {
        puVar5 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar3 + 6),pRTime._4_4_);
        if (*(int *)(puVar5 + 1) != 2) {
          __assert_fail("pPin->dir == sc_dir_Output",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                        ,0x23d,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
        }
        Vec_StrPutS(vOut,(char *)*puVar5);
        Vec_StrPutF(vOut,*(float *)(puVar5 + 4));
        Vec_StrPutF(vOut,*(float *)((long)puVar5 + 0x24));
        Vec_StrPutI(vOut,*(int *)(puVar3 + 8));
        if (puVar5[5] == 0) {
          local_f0 = "";
        }
        else {
          local_f0 = (char *)puVar5[5];
        }
        Vec_StrPutS(vOut,local_f0);
        iVar1 = Vec_WrdSize((Vec_Wrd_t *)(puVar5 + 6));
        iVar2 = Abc_Truth6WordNum(*(int *)(puVar3 + 8));
        if (iVar1 != iVar2) {
          __assert_fail("Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                        ,0x247,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
        }
        for (pRTime._0_4_ = 0; iVar1 = Vec_WrdSize((Vec_Wrd_t *)(puVar5 + 6)), (int)pRTime < iVar1;
            pRTime._0_4_ = (int)pRTime + 1) {
          Val = Vec_WrdEntry((Vec_Wrd_t *)(puVar5 + 6),(int)pRTime);
          Vec_StrPutW(vOut,Val);
        }
        iVar1 = Vec_PtrSize((Vec_Ptr_t *)(puVar5 + 8));
        if (iVar1 != *(int *)(puVar3 + 8)) {
          __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                        ,0x24c,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
        }
        for (pRTime._0_4_ = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)(puVar5 + 8)), (int)pRTime < iVar1;
            pRTime._0_4_ = (int)pRTime + 1) {
          puVar6 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar5 + 8),(int)pRTime);
          Vec_StrPutS(vOut,(char *)*puVar6);
          iVar1 = Vec_PtrSize((Vec_Ptr_t *)(puVar6 + 1));
          Vec_StrPutI(vOut,iVar1);
          iVar1 = Vec_PtrSize((Vec_Ptr_t *)(puVar6 + 1));
          if (iVar1 == 1) {
            pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)(puVar6 + 1),0);
            Vec_StrPutI(vOut,*(int *)((long)pvVar4 + 8));
            Abc_SclWriteSurface(vOut,(SC_Surface *)((long)pvVar4 + 0x18));
            Abc_SclWriteSurface(vOut,(SC_Surface *)((long)pvVar4 + 200));
            Abc_SclWriteSurface(vOut,(SC_Surface *)((long)pvVar4 + 0x178));
            Abc_SclWriteSurface(vOut,(SC_Surface *)((long)pvVar4 + 0x228));
          }
          else {
            iVar1 = Vec_PtrSize((Vec_Ptr_t *)(puVar6 + 1));
            if (iVar1 != 0) {
              __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                            ,0x260,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
          }
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void Abc_SclWriteLibrary( Vec_Str_t * vOut, SC_Lib * p )
{
    SC_WireLoad * pWL;
    SC_WireLoadSel * pWLS;
    SC_Cell * pCell;
    SC_Pin * pPin;
    int n_valid_cells;
    int i, j, k;

    Vec_StrPutI( vOut, ABC_SCL_CUR_VERSION );

    // Write non-composite fields:
    Vec_StrPutS( vOut, p->pName );
    Vec_StrPutS( vOut, p->default_wire_load );
    Vec_StrPutS( vOut, p->default_wire_load_sel );
    Vec_StrPutF( vOut, p->default_max_out_slew );

    assert( p->unit_time >= 0 );
    assert( p->unit_cap_snd >= 0 );
    Vec_StrPutI( vOut, p->unit_time );
    Vec_StrPutF( vOut, p->unit_cap_fst );
    Vec_StrPutI( vOut, p->unit_cap_snd );

    // Write 'wire_load' vector:
    Vec_StrPutI( vOut, Vec_PtrSize(&p->vWireLoads) );
    SC_LibForEachWireLoad( p, pWL, i )
    {
        Vec_StrPutS( vOut, pWL->pName );
        Vec_StrPutF( vOut, pWL->cap );
        Vec_StrPutF( vOut, pWL->slope );

        Vec_StrPutI( vOut, Vec_IntSize(&pWL->vFanout) );
        for ( j = 0; j < Vec_IntSize(&pWL->vFanout); j++ )
        {
            Vec_StrPutI( vOut, Vec_IntEntry(&pWL->vFanout, j) );
            Vec_StrPutF( vOut, Vec_FltEntry(&pWL->vLen, j) );
        }
    }

    // Write 'wire_load_sel' vector:
    Vec_StrPutI( vOut, Vec_PtrSize(&p->vWireLoadSels) );
    SC_LibForEachWireLoadSel( p, pWLS, i )
    {
        Vec_StrPutS( vOut, pWLS->pName );
        Vec_StrPutI( vOut, Vec_FltSize(&pWLS->vAreaFrom) );
        for ( j = 0; j < Vec_FltSize(&pWLS->vAreaFrom); j++)
        {
            Vec_StrPutF( vOut, Vec_FltEntry(&pWLS->vAreaFrom, j) );
            Vec_StrPutF( vOut, Vec_FltEntry(&pWLS->vAreaTo, j) );
            Vec_StrPutS( vOut, (char *)Vec_PtrEntry(&pWLS->vWireLoadModel, j) );
        }
    }

    // Write 'cells' vector:
    n_valid_cells = 0;
    SC_LibForEachCell( p, pCell, i )
        if ( !(pCell->seq || pCell->unsupp) )
            n_valid_cells++;

    Vec_StrPutI( vOut, n_valid_cells );
    SC_LibForEachCell( p, pCell, i )
    {
        if ( pCell->seq || pCell->unsupp )
            continue;

        Vec_StrPutS( vOut, pCell->pName );
        Vec_StrPutF( vOut, pCell->area );
        Vec_StrPutF( vOut, pCell->leakage );
        Vec_StrPutI( vOut, pCell->drive_strength );

        // Write 'pins': (sorted at this point; first inputs, then outputs)
        Vec_StrPutI( vOut, pCell->n_inputs);
        Vec_StrPutI( vOut, pCell->n_outputs);

        SC_CellForEachPinIn( pCell, pPin, j )
        {
            assert(pPin->dir == sc_dir_Input);
            Vec_StrPutS( vOut, pPin->pName );
            Vec_StrPutF( vOut, pPin->rise_cap );
            Vec_StrPutF( vOut, pPin->fall_cap );
        }

        SC_CellForEachPinOut( pCell, pPin, j )
        {
            SC_Timings * pRTime;
            word uWord;

            assert(pPin->dir == sc_dir_Output);
            Vec_StrPutS( vOut, pPin->pName );
            Vec_StrPutF( vOut, pPin->max_out_cap );
            Vec_StrPutF( vOut, pPin->max_out_slew );
            Vec_StrPutI( vOut, pCell->n_inputs );

            // write function
            Vec_StrPutS( vOut, pPin->func_text ? pPin->func_text : (char *)"" );

            // write truth table
            assert( Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs) );
            Vec_WrdForEachEntry( &pPin->vFunc, uWord, k ) // -- 'size = 1u << (n_vars - 6)'
                Vec_StrPutW( vOut, uWord );  // -- 64-bit number, written uncompressed (low-byte first)

            // Write 'rtiming': (pin-to-pin timing tables for this particular output)
            assert( Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs );
            SC_PinForEachRTiming( pPin, pRTime, k )
            {
                Vec_StrPutS( vOut, pRTime->pName );
                Vec_StrPutI( vOut, Vec_PtrSize(&pRTime->vTimings) );
                    // -- NOTE! After post-processing, the size of the 'rtiming[k]' vector is either
                    // 0 or 1 (in static timing, we have merged all tables to get the worst case).
                    // The case with size 0 should only occur for multi-output gates.
                if ( Vec_PtrSize(&pRTime->vTimings) == 1 )
                {
                    SC_Timing * pTime = (SC_Timing *)Vec_PtrEntry( &pRTime->vTimings, 0 );
                        // -- NOTE! We don't need to save 'related_pin' string because we have sorted 
                        // the elements on input pins.
                    Vec_StrPutI( vOut, (int)pTime->tsense);
                    Abc_SclWriteSurface( vOut, &pTime->pCellRise );
                    Abc_SclWriteSurface( vOut, &pTime->pCellFall );
                    Abc_SclWriteSurface( vOut, &pTime->pRiseTrans );
                    Abc_SclWriteSurface( vOut, &pTime->pFallTrans );
                }
                else
                    assert( Vec_PtrSize(&pRTime->vTimings) == 0 );
            }
        }
    }
}